

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall gnilk::LogManager::SendToSinks(LogManager *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  element_type *this_00;
  reference this_01;
  pointer pLVar5;
  undefined4 extraout_var;
  reference __uf;
  undefined1 local_e8 [8];
  type future_1;
  undefined1 local_c8 [8];
  future<int> future;
  LogSink *sink;
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *sinkInstance;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
  *__range2;
  deque<std::future<int>,_std::allocator<std::future<int>_>_> sinkReadyList;
  LogEvent *logEvent;
  lock_guard<std::mutex> lock;
  undefined1 local_20 [8];
  Ref ipc;
  LogManager *this_local;
  
  ipc.super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  Instance();
  GetIPC((LogManager *)local_20);
  peVar4 = std::__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->ipcHandler);
  uVar2 = (*peVar4->_vptr_LogIPCBase[4])();
  if ((uVar2 & 1) == 0) {
    lock._M_device._0_4_ = 1;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&logEvent,&this->sinkLock);
    while( true ) {
      peVar4 = std::__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->ipcHandler);
      uVar2 = (*peVar4->_vptr_LogIPCBase[4])();
      if ((uVar2 & 1) == 0) break;
      this_00 = std::__shared_ptr_access<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->cache);
      sinkReadyList.super__Deque_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node = (_Map_pointer)LogCache::Next(this_00);
      peVar4 = std::__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_20);
      iVar3 = (*peVar4->_vptr_LogIPCBase[6])
                        (peVar4,sinkReadyList.
                                super__Deque_base<std::future<int>,_std::allocator<std::future<int>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node);
      if (iVar3 < 0) {
        perror("SendToSinks, ipc->ReadEvent failed!");
        lock._M_device._0_4_ = 1;
        goto LAB_001aea0d;
      }
      LogEvent::ComposeReportString
                ((LogEvent *)
                 sinkReadyList.
                 super__Deque_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node);
      std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::deque
                ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)&__range2);
      __end2 = std::
               vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
               ::begin(&this->sinks);
      sinkInstance = (unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>
                      *)std::
                        vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
                        ::end(&this->sinks);
      while (bVar1 = __gnu_cxx::
                     operator==<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
                               (&__end2,(__normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
                                         *)&sinkInstance), ((bVar1 ^ 0xffU) & 1) != 0) {
        this_01 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
                  ::operator*(&__end2);
        pLVar5 = std::
                 unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>::
                 operator->(this_01);
        iVar3 = (*pLVar5->_vptr_LogSinkInstance[2])();
        future.super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar3);
        bVar1 = LogSink::WithinRange
                          ((LogSink *)
                           future.super___basic_future<int>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,
                           *(LogLevel *)
                            (sinkReadyList.
                             super__Deque_base<std::future<int>,_std::allocator<std::future<int>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node + 8));
        if ((bVar1) &&
           (bVar1 = LogSink::IsEnabled((LogSink *)
                                       future.super___basic_future<int>._M_state.
                                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi), bVar1)) {
          future_1.super___basic_future<int>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x29;
          std::
          async<int(gnilk::LogSink::*)(gnilk::LogEvent_const&),gnilk::LogSink*&,gnilk::LogEvent&>
                    ((type *)local_c8,
                     (LogSink **)
                     &future_1.super___basic_future<int>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     (LogEvent *)
                     &future.super___basic_future<int>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::push_back
                    ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)&__range2,
                     (value_type *)local_c8);
          std::future<int>::~future((future<int> *)local_c8);
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
        ::operator++(&__end2);
      }
      while (bVar1 = std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::empty
                               ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)
                                &__range2), ((bVar1 ^ 0xffU) & 1) != 0) {
        __uf = std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::front
                         ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)&__range2);
        std::future<int>::future((future<int> *)local_e8,__uf);
        std::future<int>::get((future<int> *)local_e8);
        std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::pop_front
                  ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)&__range2);
        std::future<int>::~future((future<int> *)local_e8);
      }
      std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::~deque
                ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)&__range2);
    }
    lock._M_device._0_4_ = 0;
LAB_001aea0d:
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&logEvent);
  }
  std::shared_ptr<gnilk::LogIPCBase>::~shared_ptr((shared_ptr<gnilk::LogIPCBase> *)local_20);
  return;
}

Assistant:

void LogManager::SendToSinks() {
    auto ipc = LogManager::Instance().GetIPC();
    if (!ipcHandler->Available()) {
        return;
    }

    std::lock_guard<std::mutex> lock(sinkLock);

    // Fetch all events from the ipc handler
    while (ipcHandler->Available()) {
        auto logEvent = cache->Next();

        if (ipc->ReadEvent(*logEvent) < 0) {
            // failed
            perror("SendToSinks, ipc->ReadEvent failed!");
            return;
        }

        logEvent->ComposeReportString();    // pre-compose the report string...
        std::deque<std::future<int>> sinkReadyList;

        for (auto &sinkInstance: sinks) {
            // This should not be problematic, except for maybe the unmanaged sink's which potentially could go out of
            // scope while we do this...
            auto sink = sinkInstance->GetSink();

            // Don't even send it unless it is within the range...
            if (!sink->WithinRange(logEvent->level)) {
                continue;
            }
            if (!sink->IsEnabled()) {
                continue;
            }

            auto future = std::async(&LogSink::Write, sink, *logEvent);
            sinkReadyList.push_back(std::move(future));
        }

        while (!sinkReadyList.empty()) {
            auto future = std::move(sinkReadyList.front());
            future.get();
            sinkReadyList.pop_front();
        }
    }
}